

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::PrepareForIndexedDraw
          (DeviceContextVkImpl *this,DRAW_FLAGS Flags,VALUE_TYPE IndexType)

{
  Uint64 UVar1;
  DRAW_FLAGS DVar2;
  VkIndexType IndexType_00;
  BufferVkImpl *pBVar3;
  Char *Message;
  VkBuffer Buffer;
  size_t sVar4;
  VkIndexType vkIndexType;
  undefined1 local_38 [8];
  string msg;
  VALUE_TYPE IndexType_local;
  DRAW_FLAGS Flags_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._M_local_buf[0xe] = IndexType;
  msg.field_2._M_local_buf[0xf] = Flags;
  PrepareForDraw(this,Flags);
  DVar2 = Diligent::operator&(msg.field_2._M_local_buf[0xf],DRAW_FLAG_VERIFY_STATES);
  if (DVar2 != DRAW_FLAG_NONE) {
    pBVar3 = RefCntAutoPtr<Diligent::BufferVkImpl>::operator*
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer);
    DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyBufferState
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBVar3,
               RESOURCE_STATE_INDEX_BUFFER,"Indexed draw call (DeviceContextVkImpl::Draw)");
  }
  if ((msg.field_2._M_local_buf[0xe] != '\x05') && (msg.field_2._M_local_buf[0xe] != '\x06')) {
    FormatString<char[66]>
              ((string *)local_38,
               (char (*) [66])"Unsupported index format. Only R16_UINT and R32_UINT are allowed.");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x332);
    std::__cxx11::string::~string((string *)local_38);
  }
  IndexType_00 = TypeToVkIndexType(msg.field_2._M_local_buf[0xe]);
  pBVar3 = RefCntAutoPtr<Diligent::BufferVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer);
  Buffer = BufferVkImpl::GetVkBuffer(pBVar3);
  UVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_IndexDataStartOffset;
  pBVar3 = Diligent::RefCntAutoPtr::operator_cast_to_BufferVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer);
  sVar4 = GetDynamicBufferOffset(this,pBVar3,true);
  VulkanUtilities::VulkanCommandBuffer::BindIndexBuffer
            (&this->m_CommandBuffer,Buffer,UVar1 + sVar4,IndexType_00);
  return;
}

Assistant:

void DeviceContextVkImpl::PrepareForIndexedDraw(DRAW_FLAGS Flags, VALUE_TYPE IndexType)
{
    PrepareForDraw(Flags);

#ifdef DILIGENT_DEVELOPMENT
    if ((Flags & DRAW_FLAG_VERIFY_STATES) != 0)
    {
        DvpVerifyBufferState(*m_pIndexBuffer, RESOURCE_STATE_INDEX_BUFFER, "Indexed draw call (DeviceContextVkImpl::Draw)");
    }
#endif
    DEV_CHECK_ERR(IndexType == VT_UINT16 || IndexType == VT_UINT32, "Unsupported index format. Only R16_UINT and R32_UINT are allowed.");
    VkIndexType vkIndexType = TypeToVkIndexType(IndexType);
    m_CommandBuffer.BindIndexBuffer(m_pIndexBuffer->GetVkBuffer(), m_IndexDataStartOffset + GetDynamicBufferOffset(m_pIndexBuffer), vkIndexType);
}